

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  basic_appender<char> bVar4;
  int iVar5;
  ulong uVar6;
  uint **ppuVar7;
  size_t sVar8;
  uint uVar9;
  uint **ppuVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  char cVar15;
  basic_specs significand_00;
  uint uVar16;
  buffer<char> *buf;
  int iVar17;
  undefined1 uVar18;
  int iVar19;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_e6 [14];
  uint local_d8;
  undefined1 local_d4 [12];
  format_specs local_c8;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  uint *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  significand_00 = (basic_specs)f->significand;
  uVar16 = f->significand_size;
  local_d4._4_8_ = ZEXT48(uVar16);
  local_e6[1] = '0';
  local_d8 = uVar16;
  local_d4._0_4_ = s;
  local_c8.super_basic_specs = significand_00;
  local_c8.width = exp_upper;
  if ((int)uVar16 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                ,0x1b6,"negative value");
  }
  uVar6 = (ulong)((uVar16 + 1) - (uint)(s == none));
  uVar9 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_e6._6_8_ = out.container;
  if ((uVar9 >> 0xe & 1) != 0) {
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar16 = (uint)local_d4._4_8_;
    uVar9 = (specs->super_basic_specs).data_;
  }
  uVar14 = auStack_a4._4_8_;
  uVar13 = local_e6._6_8_;
  uVar1 = f->exponent;
  iVar17 = uVar16 + uVar1;
  iVar5 = specs->precision;
  bVar2 = (byte)uVar9 & 7;
  local_d4._4_8_ = f;
  if (bVar2 == 1) goto LAB_001e0e4f;
  if ((uVar9 & 7) != 2) {
    if (iVar17 < -3) {
LAB_001e0e4f:
      iVar19 = uVar16 + uVar1 + -1;
      if ((uVar9 >> 0xd & 1) == 0) {
        uVar12 = 0;
        if (uVar16 == 1) {
          local_e6[0] = '\0';
          uVar12 = 0;
        }
      }
      else {
        uVar12 = 0;
        if (0 < (int)(iVar5 - uVar16)) {
          uVar12 = (ulong)(iVar5 - uVar16);
        }
        uVar6 = uVar6 + uVar12;
      }
      uVar18 = local_e6[0];
      iVar5 = 1 - iVar17;
      if (0 < iVar17) {
        iVar5 = iVar19;
      }
      lVar11 = 2;
      if (99 < iVar5) {
        lVar11 = (ulong)(999 < iVar5) + 3;
      }
      sVar8 = (3 - (ulong)(local_e6[0] == '\0')) + uVar6 + lVar11;
      local_b8._0_4_ = s;
      auStack_a4[0] = local_e6[0];
      local_b8._16_4_ = uVar16;
      auStack_a4._4_5_ = CONCAT14('0',(int)uVar12);
      auStack_a4._10_2_ = SUB82(uVar14,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar9 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar19;
      local_b8._8_8_ = significand_00;
      if (specs->width < 1) {
        uVar6 = sVar8 + *(size_t *)(local_e6._6_8_ + 8);
        if (*(size_t *)(local_e6._6_8_ + 0x10) < uVar6) {
          (**(grow_fun *)(local_e6._6_8_ + 0x18))((buffer<char> *)local_e6._6_8_,uVar6);
        }
        iVar5 = (int)uVar12;
        if (s != none) {
          sVar8 = *(size_t *)(uVar13 + 8);
          uVar6 = sVar8 + 1;
          if (*(size_t *)(uVar13 + 0x10) < uVar6) {
            (**(grow_fun *)(uVar13 + 0x18))((buffer<char> *)uVar13,uVar6);
            sVar8 = *(size_t *)(uVar13 + 8);
            uVar6 = sVar8 + 1;
          }
          *(ulong *)(uVar13 + 8) = uVar6;
          *(char *)(*(long *)uVar13 + sVar8) = (char)(0x202b2d00 >> ((byte)(s << 3) & 0x1f));
          significand_00 = (basic_specs)local_b8._8_8_;
          uVar18 = auStack_a4[0];
          iVar5 = auStack_a4._4_4_;
          uVar16 = local_b8._16_4_;
        }
        bVar4 = write_significand<fmt::v11::basic_appender<char>,char>
                          ((basic_appender<char>)uVar13,(char *)significand_00,uVar16,1,uVar18);
        if (0 < iVar5) {
          bVar4 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar4,iVar5,auStack_a4 + 8);
        }
        uVar18 = auStack_a4[9];
        sVar8 = (bVar4.container)->size_;
        uVar6 = sVar8 + 1;
        if ((bVar4.container)->capacity_ < uVar6) {
          (*(bVar4.container)->grow_)(bVar4.container,uVar6);
          sVar8 = (bVar4.container)->size_;
          uVar6 = sVar8 + 1;
        }
        (bVar4.container)->size_ = uVar6;
        (bVar4.container)->ptr_[sVar8] = uVar18;
        bVar4 = write_exponent<char,fmt::v11::basic_appender<char>>(auStack_a4._12_4_,bVar4);
      }
      else {
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_e6._6_8_,specs,sVar8,sVar8,
                           (anon_class_40_8_fd1bf2f9 *)local_b8);
      }
      return (basic_appender<char>)bVar4.container;
    }
    iVar19 = local_c8.width;
    if (0 < iVar5) {
      iVar19 = iVar5;
    }
    if (iVar19 < iVar17) goto LAB_001e0e4f;
  }
  local_c8.precision = iVar17;
  if (-1 < (int)uVar1) {
    lVar11 = uVar1 + uVar6;
    local_e6._2_4_ = iVar5 - iVar17;
    if ((uVar9 >> 0xd & 1) != 0) {
      lVar11 = lVar11 + 1;
      if (((int)local_e6._2_4_ < 1) && (bVar2 != 2)) {
        local_e6._2_4_ = 0;
      }
      else if (0 < (int)local_e6._2_4_) {
        lVar11 = lVar11 + (ulong)(uint)local_e6._2_4_;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar9 >> 0xe) & 1));
    iVar5 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppuVar10 = (uint **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar3 = 0;
      uVar13 = local_70._0_8_;
      do {
        if ((uint **)uVar13 == ppuVar10) {
          cVar15 = *(char *)((long)ppuVar10 + -1);
          uVar13 = ppuVar10;
        }
        else {
          cVar15 = *(char *)uVar13;
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_001e1113;
          uVar13 = (uint **)(uVar13 + 1);
        }
        iVar5 = iVar5 + cVar15;
        if (iVar17 <= iVar5) goto LAB_001e1113;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_001e1113:
    local_b8._0_8_ = local_d4;
    local_b8._8_8_ = &local_c8;
    unique0x00004e80 = &local_d8;
    auStack_a4._4_8_ = local_d4._4_8_;
    local_88._M_allocated_capacity = (size_type)local_e6;
    local_88._8_8_ = local_e6 + 2;
    local_78 = local_e6 + 1;
    auStack_a4._12_8_ = &local_70;
    local_90 = specs;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)local_e6._6_8_,specs,lVar11 + lVar3,lVar11 + lVar3,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar13 = local_60;
    uVar14 = local_70._0_8_;
    if ((uint **)local_70._0_8_ == &local_60) {
      return (basic_appender<char>)bVar4.container;
    }
LAB_001e12e2:
    operator_delete((void *)uVar14,uVar13 + 1);
    return (basic_appender<char>)bVar4.container;
  }
  if (0 < iVar17) {
    iVar19 = 0;
    local_e6._2_4_ = iVar5 - uVar16 & (int)(uVar9 << 0x12) >> 0x1f;
    uVar16 = local_e6._2_4_;
    if ((int)local_e6._2_4_ < 1) {
      uVar16 = 0;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar9 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      ppuVar7 = (uint **)(local_b8._0_8_ + (long)(basic_specs *)local_b8._8_8_);
      lVar11 = 0;
      ppuVar10 = (uint **)local_b8._0_8_;
      do {
        if (ppuVar10 == ppuVar7) {
          cVar15 = *(char *)((long)ppuVar7 + -1);
          ppuVar10 = ppuVar7;
        }
        else {
          cVar15 = *(char *)ppuVar10;
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_001e1251;
          ppuVar10 = (uint **)((long)ppuVar10 + 1);
        }
        iVar19 = iVar19 + cVar15;
        if (iVar17 <= iVar19) goto LAB_001e1251;
        lVar11 = lVar11 + 1;
      } while( true );
    }
    lVar11 = 0;
LAB_001e1251:
    sVar8 = uVar16 + uVar6 + lVar11 + 1;
    local_70._M_allocated_capacity = (size_type)local_d4;
    local_70._8_8_ = &local_c8;
    local_60 = &local_d8;
    local_58 = &local_c8.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)(local_e6 + 2);
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_e6._6_8_,specs,sVar8,sVar8,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    uVar13 = stack0xffffffffffffff58;
    uVar14 = local_b8._0_8_;
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
      return (basic_appender<char>)bVar4.container;
    }
    goto LAB_001e12e2;
  }
  iVar19 = -iVar17;
  local_70._M_allocated_capacity._0_4_ = iVar19;
  if (uVar16 == 0) {
    if (SBORROW4(iVar5,iVar19) != iVar5 + iVar17 < 0 && -1 < iVar5) {
      local_70._M_allocated_capacity._0_4_ = iVar5;
      iVar19 = iVar5;
    }
    if (iVar19 == 0) {
      local_e6[2] = (char)((uVar9 & 0x2000) >> 0xd);
      iVar5 = 2 - (uint)((uVar9 & 0x2000) == 0);
      iVar19 = 0;
      goto LAB_001e11eb;
    }
  }
  local_e6[2] = 1;
  iVar5 = 2;
LAB_001e11eb:
  sVar8 = (uint)(iVar5 + iVar19) + uVar6;
  local_b8._0_8_ = local_d4;
  local_b8._8_8_ = local_e6 + 2;
  unique0x00004e80 = local_e6;
  auStack_a4._4_8_ = &local_70;
  auStack_a4._12_8_ = local_e6 + 1;
  local_90 = &local_c8;
  local_88._M_allocated_capacity = (size_type)&local_d8;
  bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_e6._6_8_,specs,sVar8,sVar8,
                     (anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}